

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall
dmlc::JSONObjectReadHelper::ReadAllFields(JSONObjectReadHelper *this,JSONReader *reader)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  string key;
  LogCheckError _check_err;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  visited;
  string local_370 [32];
  string local_350 [32];
  ostringstream err;
  LogMessageFatal local_1b8;
  
  JSONReader::BeginObject(reader);
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &visited._M_t._M_impl.super__Rb_tree_header._M_header;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->map_)._M_t._M_impl.super__Rb_tree_header;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    bVar2 = JSONReader::NextObjectItem(reader,&key);
    if (!bVar2) break;
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
            ::count(&this->map_,&key);
    if (sVar3 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
      std::operator<<((ostream *)&err,"JSONReader: Unknown field ");
      std::__cxx11::string::string(local_370,(string *)&key);
      std::operator<<((ostream *)&err,local_370);
      std::__cxx11::string::~string(local_370);
      std::operator<<((ostream *)&err,", candidates are: \n");
      for (p_Var6 = (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6))
      {
        std::operator<<((ostream *)&err,'\"');
        std::__cxx11::string::string(local_350,(string *)(p_Var6 + 1));
        std::operator<<((ostream *)&err,local_350);
        std::__cxx11::string::~string(local_350);
        std::operator<<((ostream *)&err,"\"\n");
      }
      LogMessageFatal::LogMessageFatal
                (&local_1b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x3d3);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&local_1b8,(string *)&_check_err);
      std::__cxx11::string::~string((string *)&_check_err);
      LogMessageFatal::~LogMessageFatal(&local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
    }
    else {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
               ::operator[](&this->map_,&key);
      (*pmVar4->func)(reader,pmVar4->addr);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&visited,&key);
      *pmVar5 = 0;
    }
  }
  if (visited._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    for (p_Var6 = (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      if (*(char *)&p_Var6[2]._M_left == '\0') {
        local_1b8._0_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::count(&visited,(key_type *)(p_Var6 + 1));
        _err = 0;
        LogCheck_NE<unsigned_long,unsigned_int>
                  ((dmlc *)&_check_err,(unsigned_long *)&local_1b8,(uint *)&err);
        if (_check_err.str != (string *)0x0) {
          LogMessageFatal::LogMessageFatal
                    (&local_1b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                     ,0x3df);
          poVar7 = std::operator<<((ostream *)&local_1b8,"Check failed: ");
          poVar7 = std::operator<<(poVar7,"visited.count(it->first) != 0U");
          poVar7 = std::operator<<(poVar7,(string *)_check_err.str);
          poVar7 = std::operator<<(poVar7,": ");
          poVar7 = std::operator<<(poVar7,"JSONReader: Missing field \"");
          poVar7 = std::operator<<(poVar7,(string *)(p_Var6 + 1));
          poVar7 = std::operator<<(poVar7,"\"\n At ");
          JSONReader::line_info_abi_cxx11_((string *)&err,reader);
          std::operator<<(poVar7,(string *)&err);
          std::__cxx11::string::~string((string *)&err);
          LogMessageFatal::~LogMessageFatal(&local_1b8);
        }
        LogCheckError::~LogCheckError(&_check_err);
      }
    }
  }
  std::__cxx11::string::~string((string *)&key);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&visited._M_t);
  return;
}

Assistant:

inline void JSONObjectReadHelper::ReadAllFields(JSONReader *reader) {
  reader->BeginObject();
  std::map<std::string, int> visited;
  std::string key;
  while (reader->NextObjectItem(&key)) {
    if (map_.count(key) != 0) {
      Entry e = map_[key];
      (*e.func)(reader, e.addr);
      visited[key] = 0;
    } else {
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
      std::ostringstream err;
#else
      std::string err("");
#endif
      Extend(&err, "JSONReader: Unknown field ");
      Extend(&err, key);
      Extend(&err, ", candidates are: \n");
      for (std::map<std::string, Entry>::iterator
               it = map_.begin();
           it != map_.end(); ++it) {
        Extend(&err, '\"');
        Extend(&err, it->first);
        Extend(&err, "\"\n");
      }
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
      LOG(FATAL) << err.str();
#else
      LOG(FATAL) << err;
#endif
    }
  }
  if (visited.size() != map_.size()) {
    for (std::map<std::string, Entry>::iterator
             it = map_.begin();
         it != map_.end(); ++it) {
      if (it->second.optional)
        continue;
      CHECK_NE(visited.count(it->first), 0U)
          << "JSONReader: Missing field \"" << it->first << "\"\n At "
          << reader->line_info();
    }
  }
}